

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::releaseCluster(btSoftBody *this,int index)

{
  Cluster *this_00;
  Cluster *c;
  Cluster *local_20;
  
  local_20 = (this->m_clusters).m_data[index];
  if (local_20->m_leaf != (btDbvtNode *)0x0) {
    btDbvt::remove(&this->m_cdbvt,(char *)local_20->m_leaf);
  }
  this_00 = local_20;
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_20->m_framerefs);
  btAlignedObjectArray<btSoftBody::Node_*>::~btAlignedObjectArray(&this_00->m_nodes);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&this_00->m_masses);
  btAlignedFreeInternal(local_20);
  btAlignedObjectArray<btSoftBody::Cluster_*>::remove(&this->m_clusters,(char *)&local_20);
  return;
}

Assistant:

void			btSoftBody::releaseCluster(int index)
{
	Cluster*	c=m_clusters[index];
	if(c->m_leaf) m_cdbvt.remove(c->m_leaf);
	c->~Cluster();
	btAlignedFree(c);
	m_clusters.remove(c);
}